

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O1

void enet_peer_disconnect_now(ENetPeer *peer,enet_uint32 data)

{
  ENetPeerState EVar1;
  ENetProtocol command;
  ENetProtocol local_40;
  
  EVar1 = peer->state;
  if (EVar1 != ENET_PEER_STATE_DISCONNECTED) {
    if ((EVar1 != ENET_PEER_STATE_DISCONNECTING) && (EVar1 != ENET_PEER_STATE_ZOMBIE)) {
      enet_peer_reset_queues(peer);
      local_40._0_2_ = 0xff44;
      local_40.disconnect.data =
           data >> 0x18 | (data & 0xff0000) >> 8 | (data & 0xff00) << 8 | data << 0x18;
      enet_peer_queue_outgoing_command(peer,&local_40,(ENetPacket *)0x0,0,0);
      enet_host_flush(peer->host);
    }
    enet_peer_reset(peer);
    return;
  }
  return;
}

Assistant:

void
enet_peer_disconnect_now (ENetPeer * peer, enet_uint32 data)
{
    ENetProtocol command;

    if (peer -> state == ENET_PEER_STATE_DISCONNECTED)
      return;

    if (peer -> state != ENET_PEER_STATE_ZOMBIE &&
        peer -> state != ENET_PEER_STATE_DISCONNECTING)
    {
        enet_peer_reset_queues (peer);

        command.header.command = ENET_PROTOCOL_COMMAND_DISCONNECT | ENET_PROTOCOL_COMMAND_FLAG_UNSEQUENCED;
        command.header.channelID = 0xFF;
        command.disconnect.data = ENET_HOST_TO_NET_32 (data);

        enet_peer_queue_outgoing_command (peer, & command, NULL, 0, 0);

        enet_host_flush (peer -> host);
    }

    enet_peer_reset (peer);
}